

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O3

_Bool key_is_valid(ext_key *hdkey)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar1 = hdkey->priv_key[0];
  uVar2 = hdkey->version;
  if (((uVar2 == 0x4358394) || (uVar2 == 0x488ade4)) ||
     ((bVar1 != 0 && ((uVar2 == 0x488b21e || (uVar2 == 0x43587cf)))))) {
    if (hdkey->chain_code[0] == '\0') {
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 == 0x1e) {
          return false;
        }
        uVar4 = uVar5 + 1;
        lVar3 = uVar5 + 2;
        uVar5 = uVar4;
      } while (hdkey->chain_code[lVar3] == '\0');
      if (0x1e < uVar4) {
        return false;
      }
    }
    if ((hdkey->pub_key[0] & 0xfe) == 2) {
      if (hdkey->pub_key[1] == '\0') {
        uVar5 = 0;
        do {
          uVar4 = uVar5;
          if (uVar4 == 0x1f) break;
          uVar5 = uVar4 + 1;
        } while (hdkey->pub_key[uVar4 + 2] == '\0');
        bVar6 = 0x1e < uVar4;
      }
      else {
        bVar6 = false;
      }
      if (bVar1 < 2 && !bVar6) {
        if ((bVar1 == 0) && (hdkey->priv_key[1] == '\0')) {
          uVar5 = 0;
          do {
            uVar4 = uVar5;
            if (uVar4 == 0x1f) {
              return false;
            }
            uVar5 = uVar4 + 1;
          } while (hdkey->priv_key[uVar4 + 2] == '\0');
          if (0x1e < uVar4) {
            return false;
          }
        }
        if (hdkey->depth != '\0') {
          return true;
        }
        if (hdkey->parent160[0] == '\0') {
          uVar5 = 0;
          do {
            uVar4 = uVar5;
            if (uVar4 == 0x13) {
              return true;
            }
            uVar5 = uVar4 + 1;
          } while (hdkey->parent160[uVar4 + 1] == '\0');
          if (0x12 < uVar4) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool key_is_valid(const struct ext_key *hdkey)
{
    bool is_private = key_is_private(hdkey);
    bool is_master = !hdkey->depth;
    uint8_t ver_flags = is_private ? BIP32_FLAG_KEY_PRIVATE : BIP32_FLAG_KEY_PUBLIC;

    if (!version_is_valid(hdkey->version, ver_flags))
        return false;

    if (mem_is_zero(hdkey->chain_code, sizeof(hdkey->chain_code)) ||
        (hdkey->pub_key[0] != 0x2 && hdkey->pub_key[0] != 0x3) ||
        mem_is_zero(hdkey->pub_key + 1, sizeof(hdkey->pub_key) - 1))
        return false;

    if (hdkey->priv_key[0] != BIP32_FLAG_KEY_PUBLIC &&
        hdkey->priv_key[0] != BIP32_FLAG_KEY_PRIVATE)
        return false;

    if (is_private &&
        mem_is_zero(hdkey->priv_key + 1, sizeof(hdkey->priv_key) - 1))
        return false;

    if (is_master &&
        !mem_is_zero(hdkey->parent160, sizeof(hdkey->parent160)))
        return false;

    return true;
}